

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ctz_tests(void)

{
  int iVar1;
  uint uVar2;
  uint i;
  int shift;
  int local_4;
  
  uVar2 = 0;
  do {
    if (3 < uVar2) {
      uVar2 = 0;
      do {
        if (3 < uVar2) {
          return;
        }
        for (local_4 = 0; local_4 < 0x40; local_4 = local_4 + 1) {
          iVar1 = secp256k1_ctz64_var_debruijn(run_ctz_tests::b64[uVar2] << ((byte)local_4 & 0x3f));
          if (iVar1 != local_4) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                    ,0x261,
                    "test condition failed: secp256k1_ctz64_var_debruijn(b64[i] << shift) == shift")
            ;
            abort();
          }
          iVar1 = secp256k1_ctz64_var(run_ctz_tests::b64[uVar2] << ((byte)local_4 & 0x3f));
          if (iVar1 != local_4) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                    ,0x262,"test condition failed: secp256k1_ctz64_var(b64[i] << shift) == shift");
            abort();
          }
        }
        uVar2 = uVar2 + 1;
      } while( true );
    }
    for (local_4 = 0; local_4 < 0x20; local_4 = local_4 + 1) {
      iVar1 = secp256k1_ctz32_var_debruijn(run_ctz_tests::b32[uVar2] << ((byte)local_4 & 0x1f));
      if (iVar1 != local_4) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x25b,
                "test condition failed: secp256k1_ctz32_var_debruijn(b32[i] << shift) == shift");
        abort();
      }
      iVar1 = secp256k1_ctz32_var(run_ctz_tests::b32[uVar2] << ((byte)local_4 & 0x1f));
      if (iVar1 != local_4) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x25c,"test condition failed: secp256k1_ctz32_var(b32[i] << shift) == shift");
        abort();
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static void run_ctz_tests(void) {
    static const uint32_t b32[] = {1, 0xffffffff, 0x5e56968f, 0xe0d63129};
    static const uint64_t b64[] = {1, 0xffffffffffffffff, 0xbcd02462139b3fc3, 0x98b5f80c769693ef};
    int shift;
    unsigned i;
    for (i = 0; i < sizeof(b32) / sizeof(b32[0]); ++i) {
        for (shift = 0; shift < 32; ++shift) {
            CHECK(secp256k1_ctz32_var_debruijn(b32[i] << shift) == shift);
            CHECK(secp256k1_ctz32_var(b32[i] << shift) == shift);
        }
    }
    for (i = 0; i < sizeof(b64) / sizeof(b64[0]); ++i) {
        for (shift = 0; shift < 64; ++shift) {
            CHECK(secp256k1_ctz64_var_debruijn(b64[i] << shift) == shift);
            CHECK(secp256k1_ctz64_var(b64[i] << shift) == shift);
        }
    }
}